

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_SimulateSop(Abc_Obj_t *pObj,char *pSop)

{
  char *pcVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  sbyte sVar7;
  ushort uVar8;
  char *pcVar9;
  ushort uVar10;
  long lVar11;
  
  if ((pSop == (char *)0x0) || (iVar6 = Abc_SopIsExorType(pSop), iVar6 != 0)) {
    __assert_fail("pSop && !Abc_SopIsExorType(pSop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x1ba,"void Abc_FlowRetime_SimulateSop(Abc_Obj_t *, char *)");
  }
  iVar6 = Abc_SopGetVarNum(pSop);
  if (*pSop == '\0') {
    bVar4 = true;
    uVar8 = 0;
  }
  else {
    bVar4 = false;
    uVar8 = 0;
    pcVar9 = pSop;
    do {
      uVar10 = 1;
      bVar5 = false;
      for (lVar11 = 0; bVar2 = pcVar9[lVar11], (bVar2 & 0xdf) != 0; lVar11 = lVar11 + 1) {
        pvVar3 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar11]];
        if (bVar2 == 0x30) {
          sVar7 = 5;
LAB_004d5d71:
          if ((undefined1  [24])
              ((undefined1  [24])pManMR->pDataArray[*(uint *)((long)pvVar3 + 0x10)] &
              (undefined1  [24])0x60) == (undefined1  [24])0x0) {
            bVar5 = true;
          }
          else {
            uVar10 = *(ushort *)(pManMR->pDataArray + *(uint *)((long)pvVar3 + 0x10)) >> sVar7 &
                     uVar10;
          }
        }
        else if (bVar2 == 0x31) {
          sVar7 = 6;
          goto LAB_004d5d71;
        }
      }
      if (bVar5 && uVar10 != 0) {
        uVar10 = 0;
        bVar4 = true;
      }
      uVar8 = uVar8 | uVar10;
      pcVar1 = pcVar9 + (iVar6 + 3);
      pcVar9 = pcVar9 + (iVar6 + 3);
    } while (*pcVar1 != '\0');
    bVar4 = !bVar4;
  }
  iVar6 = Abc_SopGetPhase(pSop);
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
  if ((bool)(uVar8 != 0 | bVar4)) {
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
         *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) |
         (ushort)(uVar8 != (iVar6 == 0)) * 0x20 + 0x20;
  }
  return;
}

Assistant:

void Abc_FlowRetime_SimulateSop( Abc_Obj_t * pObj, char *pSop ) {
  Abc_Obj_t * pFanin;
  char *pCube;
  int i, j, rAnd, rOr, rVar, dcAnd, dcOr, v;

  assert( pSop && !Abc_SopIsExorType(pSop) );
      
  rOr = 0, dcOr = 0;

  i = Abc_SopGetVarNum(pSop);
  Abc_SopForEachCube( pSop, i, pCube ) {
    rAnd = 1, dcAnd = 0;
    Abc_CubeForEachVar( pCube, v, j ) {
      pFanin = Abc_ObjFanin(pObj, j);
      if ( v == '0' )
        rVar = FTEST(pFanin, INIT_0) ? 1 : 0;
      else if ( v == '1' )
        rVar = FTEST(pFanin, INIT_1) ? 1 : 0;
      else
        continue;
      
      if (FTEST(pFanin, INIT_CARE))
        rAnd &= rVar;
      else
        dcAnd = 1;
    }
    if (!rAnd) dcAnd = 0; /* controlling value */
    if (dcAnd) 
      dcOr = 1;
    else
      rOr |= rAnd;
  }
  if (rOr) dcOr = 0; /* controlling value */
  
  // complement the result if necessary
  if ( !Abc_SopGetPhase(pSop) )
    rOr ^= 1;
      
  Abc_FlowRetime_SetInitValue(pObj, rOr, dcOr);
}